

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::CreateDescriptorKeyRequest::CreateDescriptorKeyRequest
          (CreateDescriptorKeyRequest *this)

{
  allocator local_26;
  allocator local_25 [20];
  allocator local_11;
  CreateDescriptorKeyRequest *local_10;
  CreateDescriptorKeyRequest *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::CreateDescriptorKeyRequest>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::CreateDescriptorKeyRequest>);
  (this->super_JsonClassBase<cfd::js::api::json::CreateDescriptorKeyRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__CreateDescriptorKeyRequest_01b3cae8;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->key_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->parent_extkey_,"",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->key_path_from_parent_,"",&local_26);
  std::allocator<char>::~allocator((allocator<char> *)&local_26);
  CollectFieldName();
  return;
}

Assistant:

CreateDescriptorKeyRequest() {
    CollectFieldName();
  }